

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFunction.cpp
# Opt level: O1

Object * __thiscall LocalFunction::execute(LocalFunction *this,Engine *engine)

{
  ScriptException se;
  
  (**this->code->_vptr_ICommand)();
  return (Object *)0x0;
}

Assistant:

Object *LocalFunction::execute(Engine *engine) {
	try {
		this->code->execute(engine);
	} catch (ScriptException se) {
		if (se.getType() == ET_RETURN) {
			return se.getData();
		} else {
			throw std::runtime_error("LocalFunction::execute => unknown type of ScriptException!");
		}
	}
	return nullptr;
}